

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprocess.cpp
# Opt level: O2

void QProcess::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  ExitStatus _t2;
  int _t1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QProcess::*)(QProcess::QPrivateSignal)>
                      ((QtMocHelpers *)_a,(void **)started,0,0);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QProcess::*)(int,QProcess::ExitStatus)>
                      ((QtMocHelpers *)_a,(void **)finished,0,1);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QProcess::*)(QProcess::ProcessError)>
                      ((QtMocHelpers *)_a,(void **)errorOccurred,0,3);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QProcess::*)(QProcess::ProcessState,QProcess::QPrivateSignal)>
                      ((QtMocHelpers *)_a,(void **)stateChanged,0,4);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QProcess::*)(QProcess::QPrivateSignal)>
                      ((QtMocHelpers *)_a,(void **)readyReadStandardOutput,0,5);
    if (bVar1) {
      return;
    }
    QtMocHelpers::indexOfMethod<void(QProcess::*)(QProcess::QPrivateSignal)>
              ((QtMocHelpers *)_a,(void **)readyReadStandardError,0,6);
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    started();
    return;
  case 1:
    _t1 = *_a[1];
    _t2 = *_a[2];
    goto LAB_003ce1f0;
  case 2:
    _t1 = *_a[1];
    _t2 = NormalExit;
LAB_003ce1f0:
    finished((QProcess *)_o,_t1,_t2);
    return;
  case 3:
    errorOccurred((QProcess *)_o,*_a[1]);
    return;
  case 4:
    stateChanged((QProcess *)_o,*_a[1]);
    return;
  case 5:
    readyReadStandardOutput();
    return;
  case 6:
    readyReadStandardError();
    return;
  case 7:
    terminate((QProcess *)_o);
    return;
  case 8:
    kill((QProcess *)_o,0,_id);
    return;
  case 9:
    bVar1 = QProcessPrivate::_q_canReadStandardOutput((QProcessPrivate *)(_o->d_ptr).d);
    break;
  case 10:
    bVar1 = QProcessPrivate::_q_canReadStandardError((QProcessPrivate *)(_o->d_ptr).d);
    break;
  case 0xb:
    bVar1 = QProcessPrivate::_q_canWrite((QProcessPrivate *)(_o->d_ptr).d);
    break;
  case 0xc:
    bVar1 = QProcessPrivate::_q_startupNotification((QProcessPrivate *)(_o->d_ptr).d);
    break;
  case 0xd:
    QProcessPrivate::_q_processDied((QProcessPrivate *)(_o->d_ptr).d);
    return;
  default:
    goto switchD_003ce0f2_default;
  }
  if (*_a != (void *)0x0) {
    *(bool *)*_a = bVar1;
  }
switchD_003ce0f2_default:
  return;
}

Assistant:

void QProcess::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProcess *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(QPrivateSignal()); break;
        case 1: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QProcess::ExitStatus>>(_a[2]))); break;
        case 2: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QProcess::ProcessError>>(_a[1]))); break;
        case 4: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QProcess::ProcessState>>(_a[1])), QPrivateSignal()); break;
        case 5: _t->readyReadStandardOutput(QPrivateSignal()); break;
        case 6: _t->readyReadStandardError(QPrivateSignal()); break;
        case 7: _t->terminate(); break;
        case 8: _t->kill(); break;
        case 9: { bool _r = _t->d_func()->_q_canReadStandardOutput();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 10: { bool _r = _t->d_func()->_q_canReadStandardError();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 11: { bool _r = _t->d_func()->_q_canWrite();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 12: { bool _r = _t->d_func()->_q_startupNotification();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 13: _t->d_func()->_q_processDied(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(int , QProcess::ExitStatus )>(_a, &QProcess::finished, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QProcess::ProcessError )>(_a, &QProcess::errorOccurred, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QProcess::ProcessState , QPrivateSignal)>(_a, &QProcess::stateChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::readyReadStandardOutput, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::readyReadStandardError, 6))
            return;
    }
}